

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

void __thiscall
Js::JavascriptExternalFunction::JavascriptExternalFunction
          (JavascriptExternalFunction *this,JavascriptExternalFunction *entryPoint,DynamicType *type
          )

{
  nullptr_t local_30;
  nullptr_t local_28;
  DynamicType *local_20;
  DynamicType *type_local;
  JavascriptExternalFunction *entryPoint_local;
  JavascriptExternalFunction *this_local;
  
  local_20 = type;
  type_local = (DynamicType *)entryPoint;
  entryPoint_local = this;
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,(FunctionInfo *)EntryInfo::WrappedFunctionThunk);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e05978;
  this->flags = 0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->signature);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->callbackState,&local_28);
  Memory::WriteBarrierPtr<Js::JavascriptExternalFunction>::WriteBarrierPtr
            (&(this->field_3).wrappedMethod,(JavascriptExternalFunction *)type_local);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<int_(void_*)>::WriteBarrierPtr(&this->initMethod,&local_30);
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xfffffffe | 1;
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xffff0001;
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xfffeffff;
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xffffff;
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  return;
}

Assistant:

JavascriptExternalFunction::JavascriptExternalFunction(JavascriptExternalFunction* entryPoint, DynamicType* type)
        : RuntimeFunction(type, &EntryInfo::WrappedFunctionThunk), wrappedMethod(entryPoint), callbackState(nullptr), initMethod(nullptr),
        oneBit(1), typeSlots(0), hasAccessors(0), flags(0), deferredLength(0)
    {
        DebugOnly(VerifyEntryPoint());
    }